

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O1

void __thiscall lsim::gui::CircuitEditor::draw_ui(CircuitEditor *this,UIContext *ui_context)

{
  Point *p;
  ComponentWidget *pCVar1;
  ComponentIcon *this_00;
  _Hash_node_base *p_Var2;
  ModelWire *this_01;
  SimCircuit *pSVar3;
  pointer pPVar4;
  ImVec2 IVar5;
  Point PVar6;
  Transform transform;
  Transform transform_00;
  undefined1 p_00 [8];
  CircuitEditor *pCVar7;
  bool bVar8;
  bool bVar9;
  Value VVar10;
  node_t node_id;
  ImDrawList *this_02;
  mapped_type *pmVar11;
  pin_id_t pVar12;
  Point *pPVar13;
  ModelWireSegment *segment;
  size_t sVar14;
  ImU32 IVar15;
  ImU32 col;
  _Hash_node_base *p_Var16;
  pointer ptr_id;
  size_t sVar17;
  Point *anchor;
  pointer this_03;
  float fVar18;
  float fVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dd_06;
  Point endpoint_screen;
  Point endpoint_circuit;
  Transform widget_to_screen;
  Point local_f8;
  Point local_f0;
  Transform local_e8;
  undefined1 local_c8 [8];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [16];
  CircuitEditor *local_a8;
  Point local_a0;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  pointer local_50;
  ImVec2 local_48;
  float afStack_40 [2];
  float local_38 [2];
  
  this_02 = ImGui::GetWindowDrawList();
  local_e8.m_el[0] = (float  [2])ImGui::GetCursorScreenPos();
  IVar5 = ImGui::GetCursorScreenPos();
  Point::Point(&local_f0,IVar5.x,IVar5.y);
  IVar5 = ImGui::GetContentRegionMax();
  Point::Point(&local_a0,IVar5.x,IVar5.y);
  local_f8 = Point::operator+(&local_f0,&local_a0);
  ImGui::PushClipRect((ImVec2 *)&local_e8,(ImVec2 *)&local_f8,true);
  IVar5 = ImGui::GetCursorScreenPos();
  uStack_c0 = extraout_XMM0_Dc;
  local_c8._0_4_ = IVar5.x;
  local_c8._4_4_ = IVar5.y;
  uStack_bc = extraout_XMM0_Dd;
  IVar5 = ImGui::GetCursorScreenPos();
  Point::Point((Point *)&local_e8,IVar5.x,IVar5.y);
  IVar5 = ImGui::GetContentRegionMax();
  Point::Point(&local_f8,IVar5.x,IVar5.y);
  PVar6 = Point::operator+((Point *)&local_e8,&local_f8);
  ImDrawList::PushClipRect(this_02,(ImVec2)local_c8,(ImVec2)PVar6,true);
  if (this->m_state != CS_SIMULATING) {
    draw_grid(this,this_02);
  }
  ui_popup_embed_circuit(this);
  ui_popup_sub_circuit(this,ui_context);
  ui_popup_edit_segment(this);
  ImDrawList::ChannelsSplit(this_02,2);
  ptr_id = (this->m_widgets).
           super__Vector_base<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (this->m_widgets).
             super__Vector_base<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = this;
  if (ptr_id != local_50) {
    local_c8 = (undefined1  [8])&this->m_screen_offset;
    local_88 = (undefined1  [8])&this->m_point_pin_lut;
    local_68 = &this->m_mouse_grid_point;
    do {
      ImGui::PushID(ptr_id);
      pCVar1 = (ptr_id->_M_t).
               super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
               ._M_t.
               super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
               .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      local_e8.m_el[2] = *(float (*) [2])((long)(pCVar1->m_to_circuit).m_el + 0x10);
      local_e8.m_el[0] = (pCVar1->m_to_circuit).m_el[0];
      local_e8.m_el[1] = *(float (*) [2])((long)(pCVar1->m_to_circuit).m_el + 8);
      p_00 = local_c8;
      Transform::translate(&local_e8,(Point *)local_c8);
      PVar6 = Point::operator+(&((ptr_id->_M_t).
                                 super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                                 .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>.
                                _M_head_impl)->m_aabb_min,(Point *)p_00);
      local_b8._8_4_ = extraout_XMM0_Dc_00;
      local_b8._0_4_ = PVar6.x;
      local_b8._4_4_ = PVar6.y;
      local_b8._12_4_ = extraout_XMM0_Dd_00;
      PVar6 = Point::operator+(&((ptr_id->_M_t).
                                 super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                                 .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>.
                                _M_head_impl)->m_aabb_max,(Point *)p_00);
      local_78._8_4_ = extraout_XMM0_Dc_01;
      local_78._0_4_ = PVar6.x;
      local_78._4_4_ = PVar6.y;
      local_78._12_4_ = extraout_XMM0_Dd_01;
      local_98 = (_Hash_node_base *)CONCAT44(local_b8._4_4_,local_b8._4_4_);
      uStack_90 = local_b8._4_4_;
      uStack_8c = local_b8._4_4_;
      if (*(_Manager_type *)
           ((long)&(((ptr_id->_M_t).
                     super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                     .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl)->
                   m_draw_callback).super__Function_base + 0x10) != (_Manager_type)0x0) {
        local_f8 = local_b8._0_8_;
        ImGui::SetCursorScreenPos((ImVec2 *)&local_f8);
        ImDrawList::ChannelsSetCurrent(this_02,1);
        transform.m_el[1][0] = local_e8.m_el[1][0];
        transform.m_el[1][1] = local_e8.m_el[1][1];
        transform.m_el[0][0] = local_e8.m_el[0][0];
        transform.m_el[0][1] = local_e8.m_el[0][1];
        transform.m_el[2][0] = local_e8.m_el[2][0];
        transform.m_el[2][1] = local_e8.m_el[2][1];
        ComponentWidget::run_draw_callback
                  ((ptr_id->_M_t).
                   super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                   .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl,this,
                   transform);
      }
      ImDrawList::ChannelsSetCurrent(this_02,0);
      local_f8.y = (float)local_98;
      local_f8.x = (float)local_b8._0_4_;
      ImGui::SetCursorScreenPos((ImVec2 *)&local_f8);
      pCVar1 = (ptr_id->_M_t).
               super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
               ._M_t.
               super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
               .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      local_f8 = Point::operator-(&pCVar1->m_aabb_max,&pCVar1->m_aabb_min);
      ImGui::InvisibleButton("widget",(ImVec2 *)&local_f8);
      if ((((ptr_id->_M_t).
            super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
            ._M_t.
            super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
            .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl)->m_tooltip).
          _M_string_length != 0) {
        bVar8 = ImGui::IsItemHovered(0);
        if (bVar8) {
          ImGui::SetTooltip("%s",(((ptr_id->_M_t).
                                   super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                                   .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>.
                                  _M_head_impl)->m_tooltip)._M_dataplus._M_p);
        }
      }
      bVar8 = is_selected(this,(ptr_id->_M_t).
                               super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                               .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>.
                               _M_head_impl);
      IVar15 = 0xffc8c8c8;
      if (bVar8) {
        local_f8.y = (float)local_98;
        local_f8.x = (float)local_b8._0_4_;
        local_f0 = local_78._0_8_;
        ImDrawList::AddRectFilled
                  (this_02,(ImVec2 *)&local_f8,(ImVec2 *)&local_f0,0xff006464,0.0,0xf);
        IVar15 = 0xffc8c8c8;
        if (this->m_state == CS_DRAGGING) {
          IVar15 = 0xff646464;
        }
      }
      if (((ptr_id->_M_t).
           super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
           ._M_t.
           super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
           .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl)->m_border ==
          true) {
        local_f8.y = (float)local_98;
        local_f8.x = (float)local_b8._0_4_;
        local_f0 = local_78._0_8_;
        ImDrawList::AddRect(this_02,(ImVec2 *)&local_f8,(ImVec2 *)&local_f0,IVar15,0.0,0xf,1.0);
      }
      pCVar1 = (ptr_id->_M_t).
               super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
               ._M_t.
               super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
               .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      if ((pCVar1->m_border == true) && (this_00 = pCVar1->m_icon, this_00 != (ComponentIcon *)0x0))
      {
        local_38[0] = local_e8.m_el[2][0];
        local_38[1] = local_e8.m_el[2][1];
        local_48.x = local_e8.m_el[0][0];
        local_48.y = local_e8.m_el[0][1];
        afStack_40[0] = local_e8.m_el[1][0];
        afStack_40[1] = local_e8.m_el[1][1];
        pCVar1 = (ptr_id->_M_t).
                 super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                 .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
        local_f8 = Point::operator-(&pCVar1->m_aabb_max,&pCVar1->m_aabb_min);
        Point::Point(&local_f0,10.0,10.0);
        PVar6 = Point::operator-(&local_f8,&local_f0);
        transform_00.m_el[1][0] = afStack_40[0];
        transform_00.m_el[1][1] = afStack_40[1];
        transform_00.m_el[0][0] = local_48.x;
        transform_00.m_el[0][1] = local_48.y;
        transform_00.m_el[2][0] = local_38[0];
        transform_00.m_el[2][1] = local_38[1];
        ComponentIcon::draw(this_00,transform_00,PVar6,this_02,2,0xffc8c8c8);
      }
      bVar8 = ImGui::IsItemHovered(0);
      if (bVar8) {
        this->m_hovered_widget =
             (ptr_id->_M_t).
             super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
             ._M_t.
             super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
             .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      }
      local_b8._0_8_ = ptr_id;
      for (p_Var16 = ((__node_base *)
                     ((long)&(((ptr_id->_M_t).
                               super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                               .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>.
                              _M_head_impl)->m_endpoints)._M_h + 0x10))->_M_nxt;
          p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
        local_f8 = Transform::apply(&local_e8,(Point *)(p_Var16 + 2));
        local_f0 = Point::operator-(&local_f8,(Point *)local_c8);
        IVar15 = 0xff969696;
        if (this->m_state == CS_SIMULATING) {
          VVar10 = SimCircuit::pin_output(this->m_sim_circuit,(pin_id_t)p_Var16[1]._M_nxt);
          IVar15 = COLOR_CONNECTION[VVar10];
        }
        p_Var2 = p_Var16[1]._M_nxt;
        pmVar11 = std::__detail::
                  _Map_base<lsim::Point,_std::pair<const_lsim::Point,_unsigned_long>,_std::allocator<std::pair<const_lsim::Point,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<lsim::Point>,_lsim::gui::CircuitEditor::PointHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<lsim::Point,_std::pair<const_lsim::Point,_unsigned_long>,_std::allocator<std::pair<const_lsim::Point,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<lsim::Point>,_lsim::gui::CircuitEditor::PointHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_88,&local_f0);
        this = local_a8;
        *pmVar11 = (mapped_type)p_Var2;
        local_a0 = local_f8;
        ImDrawList::AddCircleFilled(this_02,(ImVec2 *)&local_a0,3.0,IVar15,0xc);
        fVar18 = distance_squared(local_68,&local_f0);
        if (fVar18 <= 2.0) {
          local_a0 = local_f8;
          ImDrawList::AddCircle(this_02,(ImVec2 *)&local_a0,8.0,0xc800ffff,0xc,2.0);
          this->m_hovered_pin = (pin_id_t)p_Var16[1]._M_nxt;
        }
      }
      ImGui::PopID();
      ptr_id = (pointer)(local_b8._0_8_ + 8);
    } while (ptr_id != local_50);
  }
  p_Var16 = (this->m_model_circuit->m_wires)._M_h._M_before_begin._M_nxt;
  if (p_Var16 != (_Hash_node_base *)0x0) {
    p = &this->m_screen_offset;
    local_78._0_8_ = &this->m_mouse_grid_point;
    do {
      pCVar7 = local_a8;
      this_01 = (ModelWire *)p_Var16[2]._M_nxt;
      IVar15 = 0xff787878;
      local_98 = p_Var16;
      if ((this->m_state == CS_SIMULATING) &&
         ((this_01->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this_01->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start)) {
        pSVar3 = local_a8->m_sim_circuit;
        pVar12 = ModelWire::pin(this_01,0);
        VVar10 = SimCircuit::read_pin(pSVar3,pVar12);
        IVar15 = COLOR_CONNECTION[VVar10];
        pSVar3 = pCVar7->m_sim_circuit;
        pVar12 = ModelWire::pin(this_01,0);
        node_id = SimCircuit::pin_node(pSVar3,pVar12);
        bVar8 = SimCircuit::node_dirty(pCVar7->m_sim_circuit,node_id);
      }
      else {
        bVar8 = false;
      }
      if ((this_01->m_segments).
          super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_01->m_segments).
          super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar17 = 0;
        do {
          pPVar13 = ModelWire::segment_point(this_01,sVar17,0);
          PVar6 = Point::operator+(pPVar13,p);
          uStack_c0 = extraout_XMM0_Dc_02;
          local_c8._0_4_ = PVar6.x;
          local_c8._4_4_ = PVar6.y;
          uStack_bc = extraout_XMM0_Dd_02;
          pPVar13 = ModelWire::segment_point(this_01,sVar17,1);
          PVar6 = Point::operator+(pPVar13,p);
          fStack_60 = PVar6.y;
          local_b8._4_4_ = local_c8._4_4_;
          local_b8._0_4_ = local_c8._4_4_;
          local_b8._8_4_ = local_c8._4_4_;
          local_b8._12_4_ = local_c8._4_4_;
          uStack_80 = extraout_XMM0_Dc_03;
          local_88._0_4_ = PVar6.x;
          local_88._4_4_ = PVar6.y;
          uStack_7c = extraout_XMM0_Dd_03;
          local_68 = (Point *)CONCAT44(fStack_60,fStack_60);
          fStack_5c = fStack_60;
          if (bVar8 != false) {
            local_e8.m_el[0] = local_c8;
            local_f8 = PVar6;
            ImDrawList::AddLine(this_02,(ImVec2 *)&local_e8,(ImVec2 *)&local_f8,0xaf969696,4.0);
          }
          segment = ModelWire::segment_by_index(this_01,sVar17);
          bVar9 = is_selected(local_a8,segment);
          col = IVar15;
          if (bVar9) {
            col = 0xff006464;
          }
          local_e8.m_el[0][1] = (float)local_b8._0_4_;
          local_e8.m_el[0][0] = (float)local_c8._0_4_;
          local_f8.y = (float)local_68;
          local_f8.x = (float)local_88._0_4_;
          ImDrawList::AddLine(this_02,(ImVec2 *)&local_e8,(ImVec2 *)&local_f8,col,2.0);
          sVar17 = sVar17 + 1;
        } while (sVar17 < (ulong)((long)(this_01->m_segments).
                                        super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_01->m_segments).
                                        super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      p_Var16 = local_98;
      if ((this_01->m_junctions).
          super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_01->m_junctions).
          super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar17 = 0;
        do {
          sVar14 = ModelWire::junction_segment_count(this_01,sVar17);
          if (2 < sVar14) {
            pPVar13 = ModelWire::junction_position(this_01,sVar17);
            local_e8.m_el[0] = (float  [2])Point::operator+(pPVar13,p);
            ImDrawList::AddCircleFilled(this_02,(ImVec2 *)&local_e8,4.0,IVar15,0xc);
          }
          sVar17 = sVar17 + 1;
        } while (sVar17 < (ulong)((long)(this_01->m_junctions).
                                        super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_01->m_junctions).
                                        super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      this = local_a8;
      if (local_a8->m_hovered_wire == (ModelWire *)0x0) {
        bVar8 = ModelWire::point_on_wire(this_01,(Point *)local_78._0_8_);
        if (bVar8) {
          local_e8.m_el[0] = (float  [2])Point::operator+((Point *)local_78._0_8_,p);
          ImDrawList::AddCircle(this_02,(ImVec2 *)&local_e8,8.0,0xc800ffff,0xc,2.0);
          this->m_hovered_wire = this_01;
        }
      }
      p_Var16 = p_Var16->_M_nxt;
    } while (p_Var16 != (_Hash_node_base *)0x0);
  }
  if (this->m_state == CS_AREA_SELECT) {
    PVar6 = Point::operator+(&this->m_area_sel_a,&this->m_screen_offset);
    uStack_c0 = extraout_XMM0_Dc_04;
    local_c8._0_4_ = PVar6.x;
    local_c8._4_4_ = PVar6.y;
    uStack_bc = extraout_XMM0_Dd_04;
    PVar6 = Point::operator+(&this->m_mouse_grid_point,&this->m_screen_offset);
    ImGuiEx::RectFilled((ImVec2)local_c8,(ImVec2)PVar6,0x80800000);
  }
  if (this->m_state == CS_CREATE_WIRE) {
    (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = this->m_mouse_grid_point;
    PVar6 = Point::operator+((this->m_line_anchors).
                             super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
                             super__Vector_impl_data._M_start,&this->m_screen_offset);
    this_03 = (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar4 = (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_03 != pPVar4) {
      fVar18 = PVar6.x;
      fVar19 = PVar6.y;
      uVar20 = extraout_XMM0_Dc_05;
      uVar21 = extraout_XMM0_Dd_05;
      do {
        local_88._4_4_ = fVar19;
        local_88._0_4_ = fVar18;
        uStack_80 = uVar20;
        uStack_7c = uVar21;
        local_f8 = Point::operator+(this_03,&this->m_screen_offset);
        uStack_c0 = extraout_XMM0_Dc_06;
        local_c8._0_4_ = local_f8.x;
        local_c8._4_4_ = local_f8.y;
        uStack_bc = extraout_XMM0_Dd_06;
        local_e8.m_el[0] = local_88;
        ImDrawList::AddLine(this_02,(ImVec2 *)&local_e8,(ImVec2 *)&local_f8,0xffff0000,4.0);
        this_03 = this_03 + 1;
        fVar18 = (float)local_c8._0_4_;
        fVar19 = (float)local_c8._4_4_;
        uVar20 = uStack_c0;
        uVar21 = uStack_bc;
      } while (this_03 != pPVar4);
    }
  }
  ImDrawList::ChannelsMerge(this_02);
  ImGui::PopClipRect();
  ImDrawList::PopClipRect(this_02);
  return;
}

Assistant:

void CircuitEditor::draw_ui(UIContext *ui_context) {

	auto draw_list = ImGui::GetWindowDrawList();
	
	// clipping
	ImGui::PushClipRect(ImGui::GetCursorScreenPos(), Point(ImGui::GetCursorScreenPos()) + ImGui::GetContentRegionMax(), true);
	draw_list->PushClipRect(ImGui::GetCursorScreenPos(), Point(ImGui::GetCursorScreenPos()) + ImGui::GetContentRegionMax(), true);

	// grid
	if (!is_simulating()) {
		draw_grid(draw_list);
	}

	// potential popup windows
	ui_popup_embed_circuit();
	ui_popup_sub_circuit(ui_context);
	ui_popup_edit_segment();
	
	// create two layers to draw the background and the widgets
	draw_list->ChannelsSplit(2);

	// draw all widgets
	for (auto &widget : m_widgets) {

		ImGui::PushID(&widget);
		
		// setup
		Transform widget_to_screen = widget->to_circuit();
		widget_to_screen.translate(m_screen_offset);

		const auto widget_aabb_min = widget->aabb_min() + m_screen_offset;
		const auto widget_aabb_max = widget->aabb_max() + m_screen_offset;

		// custom draw routine
		if (widget->has_draw_callback()) {
			ImGui::SetCursorScreenPos(widget_aabb_min);
			draw_list->ChannelsSetCurrent(1);
			widget->run_draw_callback(this, widget_to_screen);
		}
	
		// invisible button used for widget selection
		draw_list->ChannelsSetCurrent(0);         // background
		ImGui::SetCursorScreenPos(widget_aabb_min);
		ImGui::InvisibleButton("widget", widget->aabb_size());

		// tooltip
		if (widget->has_tooltip() && ImGui::IsItemHovered()) {
			ImGui::SetTooltip("%s", widget->tooltip());
		}

		// draw border
		auto border_color = COLOR_COMPONENT_BORDER;

		if (is_selected(widget.get())) {
			draw_list->AddRectFilled(widget_aabb_min, widget_aabb_max, COLOR_COMPONENT_SELECTED);
			if (m_state == CS_DRAGGING) {
				border_color = COLOR_COMPONENT_BORDER_DRAGGING;
			}
		}

		if (widget->has_border()) {
  		  	draw_list->AddRect(widget_aabb_min, widget_aabb_max, border_color);
		}

		// draw icon
		if (widget->has_border() && widget->icon() != nullptr) {
    		widget->icon()->draw(widget_to_screen, widget->aabb_size() - Point(10,10), 
							   draw_list, 2, COLOR_COMPONENT_ICON);
		}

		// check for mouse hover
		if (ImGui::IsItemHovered()) {
			m_hovered_widget = widget.get();
		}

		// end points
		for (const auto &pair : widget->endpoints()) {
			// pair.first = pin-id ; pair.second = position
			auto endpoint_screen = widget_to_screen.apply(pair.second);
			auto endpoint_circuit = endpoint_screen - m_screen_offset;

			auto pin_color = COLOR_ENDPOINT;
			if (is_simulating()) {
				pin_color = COLOR_CONNECTION[m_sim_circuit->pin_output(pair.first)];
			}

			m_point_pin_lut[endpoint_circuit] = pair.first;

			draw_list->AddCircleFilled(endpoint_screen, 3, pin_color);

			if (distance_squared(m_mouse_grid_point, endpoint_circuit) <= 2) {
				draw_list->AddCircle(endpoint_screen, 8, COLOR_ENDPOINT_HOVER, 12, 2);
				m_hovered_pin = pair.first;
			}
		}

		ImGui::PopID();
	}

	// draw wires
	for (const auto &wire_it : m_model_circuit->wires()) {
		auto wire = wire_it.second.get();
		auto wire_color = COLOR_CONNECTION_UNDEFINED;
		bool dirty_node = false;

		// check color & highlight when simulation is running
		if (is_simulating() && wire->num_pins() > 0) {
			auto value = m_sim_circuit->read_pin(wire->pin(0));
			wire_color = COLOR_CONNECTION[value];

			auto node_id = m_sim_circuit->pin_node(wire->pin(0));
			dirty_node = m_sim_circuit->node_dirty(node_id);
		}

		// segments
		for (size_t idx = 0; idx < wire->num_segments(); ++idx) {
			const auto p0 = wire->segment_point(idx, 0) + m_screen_offset;
			const auto p1 = wire->segment_point(idx, 1) + m_screen_offset;

			if (dirty_node) {
				draw_list->AddLine(p0, p1, COLOR_CONNECTION_DIRTY, 4.0f);
			}

			auto segment_color = is_selected(wire->segment_by_index(idx)) ? COLOR_WIRE_SELECTED : wire_color;
			draw_list->AddLine(p0, p1, segment_color, 2.0f);
		}

		// draw junctions with more than 2 segments
		for (size_t idx = 0; idx < wire->num_junctions(); ++idx) {
			if (wire->junction_segment_count(idx) > 2) {
				draw_list->AddCircleFilled(wire->junction_position(idx) + m_screen_offset, 4, wire_color);
			}
		}
		
		// check for hovered wire
		if (m_hovered_wire == nullptr && wire->point_on_wire(m_mouse_grid_point)) {
			draw_list->AddCircle(m_mouse_grid_point + m_screen_offset, 8, COLOR_ENDPOINT_HOVER, 12, 2);
			m_hovered_wire = wire;
		}
	} 

	// draw area selection box
	if (m_state == CS_AREA_SELECT) {
		ImGuiEx::RectFilled(m_area_sel_a + m_screen_offset, m_mouse_grid_point + m_screen_offset, 
							IM_COL32(0, 0, 128, 128));
	}

	// draw wire under construction
	if (m_state == CS_CREATE_WIRE) {
		m_line_anchors.back() = m_mouse_grid_point;
		Point p0 = m_line_anchors.front() + m_screen_offset;

		for (const auto &anchor : m_line_anchors) {
			Point p1 = anchor + m_screen_offset;
			draw_list->AddLine(p0, p1, IM_COL32(0, 0, 255, 255), 4);
			p0 = p1;
		}
	}

	draw_list->ChannelsMerge();
	ImGui::PopClipRect();
	draw_list->PopClipRect();
}